

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O2

void __thiscall QAccessibleMenuItem::doAction(QAccessibleMenuItem *this,QString *actionName)

{
  Data *pDVar1;
  char cVar2;
  bool bVar3;
  QString *pQVar4;
  QMenuBar *this_00;
  QMenu *pQVar5;
  QMenu *pQVar6;
  QWidget *this_01;
  QObject *pQVar7;
  
  cVar2 = QAction::isEnabled();
  if (cVar2 != '\0') {
    pQVar4 = (QString *)QAccessibleActionInterface::pressAction();
    bVar3 = ::comparesEqual(actionName,pQVar4);
    if (bVar3) {
      QAction::trigger(this->m_action);
      return;
    }
    pQVar4 = (QString *)QAccessibleActionInterface::showMenuAction();
    bVar3 = ::comparesEqual(actionName,pQVar4);
    if (bVar3) {
      pDVar1 = (this->m_owner).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar7 = (QObject *)0x0;
      }
      else {
        pQVar7 = (this->m_owner).wp.value;
      }
      this_00 = QtPrivate::qobject_cast_helper<QMenuBar*,QObject>(pQVar7);
      if (this_00 != (QMenuBar *)0x0) {
        pQVar5 = QAction::menu<QMenu*>(this->m_action);
        if (pQVar5 != (QMenu *)0x0) {
          pQVar5 = QAction::menu<QMenu*>(this->m_action);
          if ((((pQVar5->super_QWidget).data)->widget_attributes & 0x8000) != 0) {
LAB_004ceaa3:
            this_01 = &QAction::menu<QMenu*>(this->m_action)->super_QWidget;
            QWidget::hide(this_01);
            return;
          }
        }
        QMenuBar::setActiveAction(this_00,this->m_action);
        return;
      }
      pDVar1 = (this->m_owner).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar7 = (QObject *)0x0;
      }
      else {
        pQVar7 = (this->m_owner).wp.value;
      }
      pQVar5 = QtPrivate::qobject_cast_helper<QMenu*,QObject>(pQVar7);
      if (pQVar5 != (QMenu *)0x0) {
        pQVar6 = QAction::menu<QMenu*>(this->m_action);
        if (pQVar6 != (QMenu *)0x0) {
          pQVar6 = QAction::menu<QMenu*>(this->m_action);
          if ((((pQVar6->super_QWidget).data)->widget_attributes & 0x8000) != 0) goto LAB_004ceaa3;
        }
        QMenu::setActiveAction(pQVar5,this->m_action);
        return;
      }
    }
  }
  return;
}

Assistant:

void QAccessibleMenuItem::doAction(const QString &actionName)
{
    if (!m_action->isEnabled())
        return;

    if (actionName == pressAction()) {
        m_action->trigger();
    } else if (actionName == showMenuAction()) {
#if QT_CONFIG(menubar)
        if (QMenuBar *bar = qobject_cast<QMenuBar*>(owner())) {
            if (m_action->menu() && m_action->menu()->isVisible()) {
                m_action->menu()->hide();
            } else {
                bar->setActiveAction(m_action);
            }
        } else
#endif
          if (QMenu *menu = qobject_cast<QMenu*>(owner())){
            if (m_action->menu() && m_action->menu()->isVisible()) {
                m_action->menu()->hide();
            } else {
                menu->setActiveAction(m_action);
            }
        }
    }
}